

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

bool __thiscall
QFontDatabasePrivate::isApplicationFont(QFontDatabasePrivate *this,QString *fileName)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    uVar1 = (this->applicationFonts).d.size;
    uVar4 = uVar4 + 1;
    if (uVar1 <= uVar4) break;
    bVar2 = ::comparesEqual((QString *)
                            ((long)&(((this->applicationFonts).d.ptr)->fileName).d.d + lVar3),
                            fileName);
    lVar3 = lVar3 + 0x48;
  } while (!bVar2);
  return uVar4 < uVar1;
}

Assistant:

bool QFontDatabasePrivate::isApplicationFont(const QString &fileName)
{
    for (int i = 0; i < applicationFonts.size(); ++i)
        if (applicationFonts.at(i).fileName == fileName)
            return true;
    return false;
}